

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_gains.hpp
# Opt level: O0

void __thiscall
ear::OutputGainMat::write_mat<Eigen::Matrix<double,_1,_1,0,_1,_1>>
          (OutputGainMat *this,Matrix<double,__1,__1,_0,__1,__1> *mat)

{
  Index IVar1;
  Index IVar2;
  ulong uVar3;
  Scalar *pSVar4;
  ulong local_28;
  size_t row;
  size_t col;
  Matrix<double,__1,__1,_0,__1,__1> *mat_local;
  OutputGainMat *this_local;
  
  IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    (&mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  IVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    (&mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  (**this->_vptr_OutputGainMat)(this,IVar1,IVar2);
  row = 0;
  while( true ) {
    uVar3 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                      (&mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
    if (uVar3 <= row) break;
    local_28 = 0;
    while( true ) {
      uVar3 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                        (&mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
      if (uVar3 <= local_28) break;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)mat,
                          local_28,row);
      (*this->_vptr_OutputGainMat[3])(*pSVar4,this,local_28,row);
      local_28 = local_28 + 1;
    }
    row = row + 1;
  }
  return;
}

Assistant:

void write_mat(T mat) {
      check_size(mat.rows(), mat.cols());
      for (size_t col = 0; col < (size_t)mat.cols(); col++)
        for (size_t row = 0; row < (size_t)mat.rows(); row++)
          write(row, col, mat(row, col));
    }